

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_DCtx_reset(ZSTD_DCtx *dctx,ZSTD_ResetDirective reset)

{
  if ((reset & ~ZSTD_reset_parameters) == ZSTD_reset_session_only) {
    dctx->streamStage = zdss_init;
    dctx->noForwardProgress = 0;
  }
  if ((reset & ~ZSTD_reset_session_only) == ZSTD_reset_parameters) {
    if (dctx->streamStage != zdss_init) {
      return 0xffffffffffffffc4;
    }
    ZSTD_freeDDict(dctx->ddictLocal);
    dctx->dictUses = ZSTD_dont_use;
    dctx->ddictLocal = (ZSTD_DDict *)0x0;
    dctx->ddict = (ZSTD_DDict *)0x0;
    ZSTD_DCtx_resetParameters(dctx);
  }
  return 0;
}

Assistant:

size_t ZSTD_DCtx_reset(ZSTD_DCtx* dctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        dctx->streamStage = zdss_init;
        dctx->noForwardProgress = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
        ZSTD_clearDict(dctx);
        ZSTD_DCtx_resetParameters(dctx);
    }
    return 0;
}